

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# wat-writer.cc
# Opt level: O2

Result __thiscall
wabt::anon_unknown_1::WatWriter::ExprVisitorDelegate::BeginTryTableExpr
          (ExprVisitorDelegate *this,TryTableExpr *expr)

{
  int *piVar1;
  WatWriter *pWVar2;
  pointer pTVar3;
  char *s;
  ulong uVar4;
  Var *var;
  
  pWVar2 = this->writer_;
  s = Opcode::GetName((Opcode *)&Opcode::TryTable_Opcode);
  WritePutsSpace(pWVar2,s);
  if ((expr->block).label._M_string_length == 0) {
    WriteTypes(this->writer_,&(expr->block).decl.sig.param_types,"param");
    WriteTypes(this->writer_,&(expr->block).decl.sig.result_types,"result");
    pWVar2 = this->writer_;
    Writef(pWVar2," ;; label = @%u",
           ((long)(pWVar2->super_ModuleContext).label_stack_.
                  super__Vector_base<wabt::Label,_std::allocator<wabt::Label>_>._M_impl.
                  super__Vector_impl_data._M_finish -
           (long)(pWVar2->super_ModuleContext).label_stack_.
                 super__Vector_base<wabt::Label,_std::allocator<wabt::Label>_>._M_impl.
                 super__Vector_impl_data._M_start) / 0x58 & 0xffffffff);
  }
  else {
    WriteString(this->writer_,&(expr->block).label,Space);
    WriteTypes(this->writer_,&(expr->block).decl.sig.param_types,"param");
    WriteTypes(this->writer_,&(expr->block).decl.sig.result_types,"result");
  }
  WriteNewline(this->writer_,true);
  piVar1 = &this->writer_->indent_;
  *piVar1 = *piVar1 + 2;
  pTVar3 = (expr->catches).super__Vector_base<wabt::TableCatch,_std::allocator<wabt::TableCatch>_>.
           _M_impl.super__Vector_impl_data._M_finish;
  for (var = &((expr->catches).
               super__Vector_base<wabt::TableCatch,_std::allocator<wabt::TableCatch>_>._M_impl.
               super__Vector_impl_data._M_start)->target; (pointer)&var[-2].field_2 != pTVar3;
      var = (Var *)&var[2].field_2) {
    WritePuts(this->writer_,"(",None);
    uVar4 = (ulong)(uint)var[1].loc.filename._M_len;
    if (uVar4 < 4) {
      WritePutsSpace(this->writer_,*(char **)(&DAT_001996d0 + uVar4 * 8));
      if ((uint)var[1].loc.filename._M_len < 2) {
        WriteVar(this->writer_,var + -1,Space);
      }
    }
    WriteBrVar(this->writer_,var,None);
    WritePuts(this->writer_,")",Newline);
  }
  ModuleContext::BeginBlock(&this->writer_->super_ModuleContext,TryTable,&expr->block);
  return (Result)Ok;
}

Assistant:

Result WatWriter::ExprVisitorDelegate::BeginTryTableExpr(TryTableExpr* expr) {
  // copied from WriteBeginBlock, try_table needs to push label *after*
  // writing catches
  writer_->WritePutsSpace(Opcode::TryTable_Opcode.GetName());
  bool has_label = !expr->block.label.empty();
  if (has_label) {
    writer_->WriteString(expr->block.label, NextChar::Space);
  }
  writer_->WriteTypes(expr->block.decl.sig.param_types, "param");
  writer_->WriteTypes(expr->block.decl.sig.result_types, "result");
  if (!has_label) {
    writer_->Writef(" ;; label = @%" PRIindex, writer_->GetLabelStackSize());
  }
  writer_->WriteNewline(FORCE_NEWLINE);
  writer_->Indent();
  for (const auto& catch_ : expr->catches) {
    writer_->WritePuts("(", NextChar::None);
    switch (catch_.kind) {
      case CatchKind::Catch:
        writer_->WritePutsSpace("catch");
        break;
      case CatchKind::CatchRef:
        writer_->WritePutsSpace("catch_ref");
        break;
      case CatchKind::CatchAll:
        writer_->WritePutsSpace("catch_all");
        break;
      case CatchKind::CatchAllRef:
        writer_->WritePutsSpace("catch_all_ref");
        break;
    }
    if (catch_.kind == CatchKind::Catch || catch_.kind == CatchKind::CatchRef) {
      writer_->WriteVar(catch_.tag, NextChar::Space);
    }
    writer_->WriteBrVar(catch_.target, NextChar::None);
    writer_->WritePuts(")", NextChar::Newline);
  }
  writer_->BeginBlock(LabelType::TryTable, expr->block);
  return Result::Ok;
}